

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deep.cpp
# Opt level: O0

void anon_unknown.dwarf_2effe::generateRandomTileFile
               (string *filename,int channelCount,Compression compression)

{
  PixelType PVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  ostream *poVar6;
  string *psVar7;
  char *pcVar8;
  long lVar9;
  long lVar10;
  uint *puVar11;
  reference pvVar12;
  Array2D<void_*> *pAVar13;
  void **ppvVar14;
  Array2D<unsigned_int> *pAVar15;
  void *pvVar16;
  Array<Imf_3_4::Array2D<void_*>_> *this;
  Compression in_EDX;
  int in_ESI;
  string *in_RDI;
  float fVar17;
  int k_1;
  int j_2;
  int i_5;
  uint l;
  int k;
  int dwx;
  int dwy;
  int x;
  int y;
  Box2i box;
  int i_4;
  int j_1;
  Box2i dataWindowL;
  int lx;
  int ly;
  int pointerSize;
  int sampleSize;
  string str_1;
  stringstream ss_1;
  PixelType type_1;
  int i_3;
  int memOffset;
  int j;
  int i_2;
  Array2D<unsigned_int> sampleCount;
  int i_1;
  Array<Imf_3_4::Array2D<void_*>_> data;
  DeepFrameBuffer frameBuffer;
  DeepTiledOutputFile file;
  string str;
  stringstream ss;
  int type;
  int i;
  anon_class_8_1_26b32173 generate_random_int;
  default_random_engine generator;
  bool relativeCoords;
  float in_stack_fffffffffffff8dc;
  undefined4 uVar18;
  undefined4 in_stack_fffffffffffff8e4;
  undefined4 in_stack_fffffffffffff8e8;
  int in_stack_fffffffffffff8ec;
  undefined4 in_stack_fffffffffffff8f0;
  undefined4 in_stack_fffffffffffff8f4;
  long in_stack_fffffffffffff8f8;
  DeepFrameBuffer *in_stack_fffffffffffff900;
  undefined4 in_stack_fffffffffffff938;
  undefined4 in_stack_fffffffffffff93c;
  undefined4 in_stack_fffffffffffff940;
  undefined4 in_stack_fffffffffffff944;
  long in_stack_fffffffffffff960;
  undefined4 in_stack_fffffffffffff968;
  undefined4 in_stack_fffffffffffff96c;
  Array2D<Imf_3_4::Array2D<unsigned_int>_> *in_stack_fffffffffffff970;
  int local_594;
  int local_590;
  int local_58c;
  uint local_588;
  int local_584;
  int local_578;
  int local_574;
  int local_570;
  int local_56c;
  int local_568;
  int local_564;
  int local_560;
  int local_55c;
  int local_558;
  int local_554;
  int local_548;
  int local_544;
  DeepSlice local_540 [56];
  int local_508;
  int local_504;
  DeepSlice local_500 [32];
  stringstream local_4e0 [16];
  ostream local_4d0 [376];
  PixelType local_358;
  int local_354;
  Slice local_350 [60];
  int local_314;
  int local_310;
  int local_30c;
  Array2D<unsigned_int> local_308;
  int local_2ec;
  Array local_2e8 [16];
  Slice local_2d8 [104];
  undefined1 local_270 [32];
  Channel local_250 [16];
  Channel local_240 [16];
  Channel local_230 [16];
  Channel local_220 [32];
  stringstream local_200 [16];
  ostream local_1f0 [376];
  int local_78;
  int local_74;
  undefined1 *local_70;
  undefined1 local_68 [11];
  undefined1 local_5d;
  Vec2<float> local_50;
  Header local_48 [56];
  Compression local_10;
  int local_c;
  string *local_8;
  
  local_10 = in_EDX;
  local_c = in_ESI;
  local_8 = in_RDI;
  poVar6 = std::operator<<((ostream *)&std::cout,"  generating deep tiled file \'");
  poVar6 = std::operator<<(poVar6,local_8);
  poVar6 = std::operator<<(poVar6,"\' compression ");
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_10);
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  Imath_3_2::Vec2<float>::Vec2(&local_50,0.0,0.0);
  Imf_3_4::Header::Header
            (local_48,(Box *)(anonymous_namespace)::displayWindow,
             (Box *)&(anonymous_namespace)::dataWindow,1.0,(Vec2 *)&local_50,1.0,INCREASING_Y,
             local_10);
  Imf_3_4::Header::operator=((Header *)(anonymous_namespace)::header,local_48);
  Imf_3_4::Header::~Header(local_48);
  local_5d = 0;
  std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>::
  linear_congruential_engine
            ((linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)0x12bdd1);
  local_70 = local_68;
  std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x12bded);
  for (local_74 = 0; local_74 < local_c; local_74 = local_74 + 1) {
    local_78 = generateRandomTileFile::anon_class_8_1_26b32173::operator()
                         ((anon_class_8_1_26b32173 *)
                          CONCAT44(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0),
                          in_stack_fffffffffffff8ec);
    std::__cxx11::stringstream::stringstream(local_200);
    std::ostream::operator<<(local_1f0,local_74);
    std::__cxx11::stringstream::str();
    if (local_78 == 0) {
      psVar7 = (string *)Imf_3_4::Header::channels();
      Imf_3_4::Channel::Channel(local_230,UINT,1,1,false);
      Imf_3_4::ChannelList::insert(psVar7,local_220);
    }
    if (local_78 == 1) {
      psVar7 = (string *)Imf_3_4::Header::channels();
      Imf_3_4::Channel::Channel(local_240,HALF,1,1,false);
      Imf_3_4::ChannelList::insert(psVar7,local_220);
    }
    if (local_78 == 2) {
      psVar7 = (string *)Imf_3_4::Header::channels();
      Imf_3_4::Channel::Channel(local_250,FLOAT,1,1,false);
      Imf_3_4::ChannelList::insert(psVar7,local_220);
    }
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0),
               (value_type_conflict5 *)CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8)
              );
    std::__cxx11::string::~string((string *)local_220);
    std::__cxx11::stringstream::~stringstream(local_200);
  }
  Imf_3_4::Header::setType((string *)(anonymous_namespace)::header);
  iVar2 = generateRandomTileFile::anon_class_8_1_26b32173::operator()
                    ((anon_class_8_1_26b32173 *)
                     CONCAT44(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0),
                     in_stack_fffffffffffff8ec);
  iVar3 = generateRandomTileFile::anon_class_8_1_26b32173::operator()
                    ((anon_class_8_1_26b32173 *)
                     CONCAT44(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0),
                     in_stack_fffffffffffff8ec);
  Imf_3_4::TileDescription::TileDescription
            ((TileDescription *)(local_270 + 0x10),iVar2 + 1,iVar3 + 1,RIPMAP_LEVELS,ROUND_DOWN);
  Imf_3_4::Header::setTileDescription((TileDescription *)(anonymous_namespace)::header);
  pcVar8 = (char *)std::__cxx11::string::c_str();
  remove(pcVar8);
  pcVar8 = (char *)std::__cxx11::string::c_str();
  Imf_3_4::DeepTiledOutputFile::DeepTiledOutputFile
            ((DeepTiledOutputFile *)local_270,pcVar8,(Header *)(anonymous_namespace)::header,8);
  Imf_3_4::DeepFrameBuffer::DeepFrameBuffer(in_stack_fffffffffffff900);
  Imf_3_4::Array<Imf_3_4::Array2D<void_*>_>::Array
            ((Array<Imf_3_4::Array2D<void_*>_> *)
             CONCAT44(in_stack_fffffffffffff944,in_stack_fffffffffffff940),
             CONCAT44(in_stack_fffffffffffff93c,in_stack_fffffffffffff938));
  for (local_2ec = 0; local_2ec < local_c; local_2ec = local_2ec + 1) {
    Imf_3_4::Array::operator_cast_to_Array2D_(local_2e8);
    Imf_3_4::Array2D<void_*>::resizeErase
              ((Array2D<void_*> *)in_stack_fffffffffffff900,in_stack_fffffffffffff8f8,
               CONCAT44(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0));
  }
  Imf_3_4::Array2D<unsigned_int>::Array2D(&local_308);
  Imf_3_4::Array2D<unsigned_int>::resizeErase
            ((Array2D<unsigned_int> *)in_stack_fffffffffffff900,in_stack_fffffffffffff8f8,
             CONCAT44(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0));
  poVar6 = std::operator<<((ostream *)&std::cout,"   tileSizeX ");
  uVar4 = Imf_3_4::DeepTiledOutputFile::tileXSize();
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,uVar4);
  poVar6 = std::operator<<(poVar6,"   tileSizeY ");
  uVar4 = Imf_3_4::DeepTiledOutputFile::tileYSize();
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,uVar4);
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  Imf_3_4::DeepTiledOutputFile::numYLevels();
  Imf_3_4::DeepTiledOutputFile::numXLevels();
  Imf_3_4::Array2D<Imf_3_4::Array2D<unsigned_int>_>::resizeErase
            (in_stack_fffffffffffff970,CONCAT44(in_stack_fffffffffffff96c,in_stack_fffffffffffff968)
             ,in_stack_fffffffffffff960);
  for (local_30c = 0; lVar9 = (long)local_30c,
      lVar10 = Imf_3_4::Array2D<Imf_3_4::Array2D<unsigned_int>_>::height
                         ((Array2D<Imf_3_4::Array2D<unsigned_int>_> *)
                          (anonymous_namespace)::sampleCountTiles), lVar9 < lVar10;
      local_30c = local_30c + 1) {
    for (local_310 = 0; lVar9 = (long)local_310,
        lVar10 = Imf_3_4::Array2D<Imf_3_4::Array2D<unsigned_int>_>::width
                           ((Array2D<Imf_3_4::Array2D<unsigned_int>_> *)
                            (anonymous_namespace)::sampleCountTiles), lVar9 < lVar10;
        local_310 = local_310 + 1) {
      Imf_3_4::Array2D<Imf_3_4::Array2D<unsigned_int>_>::operator[]
                ((Array2D<Imf_3_4::Array2D<unsigned_int>_> *)(anonymous_namespace)::sampleCountTiles
                 ,(long)local_30c);
      Imf_3_4::Array2D<unsigned_int>::resizeErase
                ((Array2D<unsigned_int> *)in_stack_fffffffffffff900,in_stack_fffffffffffff8f8,
                 CONCAT44(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0));
    }
  }
  local_314 = (anonymous_namespace)::dataWindow + DAT_00383d8c * 0x111;
  puVar11 = Imf_3_4::Array2D<unsigned_int>::operator[](&local_308,0);
  uVar18 = 0;
  Imf_3_4::Slice::Slice
            (local_350,UINT,(char *)(puVar11 + -(long)local_314),4,0x444,1,1,0.0,false,false);
  Imf_3_4::DeepFrameBuffer::insertSampleCountSlice(local_2d8);
  for (local_354 = 0; local_354 < local_c; local_354 = local_354 + 1) {
    local_358 = NUM_PIXELTYPES;
    pvVar12 = std::vector<int,_std::allocator<int>_>::operator[]
                        ((vector<int,_std::allocator<int>_> *)(anonymous_namespace)::channelTypes,
                         (long)local_354);
    if (*pvVar12 == 0) {
      local_358 = UINT;
    }
    pvVar12 = std::vector<int,_std::allocator<int>_>::operator[]
                        ((vector<int,_std::allocator<int>_> *)(anonymous_namespace)::channelTypes,
                         (long)local_354);
    if (*pvVar12 == 1) {
      local_358 = HALF;
    }
    pvVar12 = std::vector<int,_std::allocator<int>_>::operator[]
                        ((vector<int,_std::allocator<int>_> *)(anonymous_namespace)::channelTypes,
                         (long)local_354);
    if (*pvVar12 == 2) {
      local_358 = FLOAT;
    }
    std::__cxx11::stringstream::stringstream(local_4e0);
    std::ostream::operator<<(local_4d0,local_354);
    std::__cxx11::stringstream::str();
    local_504 = 0;
    pvVar12 = std::vector<int,_std::allocator<int>_>::operator[]
                        ((vector<int,_std::allocator<int>_> *)(anonymous_namespace)::channelTypes,
                         (long)local_354);
    if (*pvVar12 == 0) {
      local_504 = 4;
    }
    pvVar12 = std::vector<int,_std::allocator<int>_>::operator[]
                        ((vector<int,_std::allocator<int>_> *)(anonymous_namespace)::channelTypes,
                         (long)local_354);
    if (*pvVar12 == 1) {
      local_504 = 2;
    }
    pvVar12 = std::vector<int,_std::allocator<int>_>::operator[]
                        ((vector<int,_std::allocator<int>_> *)(anonymous_namespace)::channelTypes,
                         (long)local_354);
    PVar1 = local_358;
    if (*pvVar12 == 2) {
      local_504 = 4;
    }
    local_508 = 8;
    pAVar13 = Imf_3_4::Array::operator_cast_to_Array2D_(local_2e8);
    ppvVar14 = Imf_3_4::Array2D<void_*>::operator[](pAVar13 + local_354,0);
    in_stack_fffffffffffff8f0 = 0;
    uVar18 = 1;
    Imf_3_4::DeepSlice::DeepSlice
              (local_540,PVar1,(char *)(ppvVar14 + -(long)local_314),(long)local_508,
               (long)(local_508 * 0x111),(long)local_504,1,1,0.0,false,false);
    Imf_3_4::DeepFrameBuffer::insert((string *)local_2d8,local_500);
    std::__cxx11::string::~string((string *)local_500);
    std::__cxx11::stringstream::~stringstream(local_4e0);
  }
  Imf_3_4::DeepTiledOutputFile::setFrameBuffer((DeepFrameBuffer *)local_270);
  for (local_544 = 0; iVar2 = local_544, iVar3 = Imf_3_4::DeepTiledOutputFile::numYLevels(),
      iVar2 < iVar3; local_544 = local_544 + 1) {
    for (local_548 = 0; iVar2 = local_548, iVar3 = Imf_3_4::DeepTiledOutputFile::numXLevels(),
        iVar2 < iVar3; local_548 = local_548 + 1) {
      Imf_3_4::DeepTiledOutputFile::dataWindowForLevel((int)&local_558,(int)local_270);
      for (local_55c = 0; iVar2 = local_55c,
          iVar3 = Imf_3_4::DeepTiledOutputFile::numYTiles((int)local_270), iVar2 < iVar3;
          local_55c = local_55c + 1) {
        for (local_560 = 0; iVar2 = local_560,
            iVar3 = Imf_3_4::DeepTiledOutputFile::numXTiles((int)local_270), iVar2 < iVar3;
            local_560 = local_560 + 1) {
          Imf_3_4::DeepTiledOutputFile::dataWindowForTile
                    ((int)&local_570,(int)local_270,local_560,local_55c);
          for (local_574 = local_56c; local_574 <= local_564; local_574 = local_574 + 1) {
            for (local_578 = local_570; local_578 <= local_568; local_578 = local_578 + 1) {
              iVar2 = local_574 - local_554;
              iVar3 = local_578 - local_558;
              iVar5 = generateRandomTileFile::anon_class_8_1_26b32173::operator()
                                ((anon_class_8_1_26b32173 *)
                                 CONCAT44(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0),
                                 in_stack_fffffffffffff8ec);
              uVar4 = iVar5 + 1;
              pAVar15 = &local_308;
              puVar11 = Imf_3_4::Array2D<unsigned_int>::operator[](pAVar15,(long)iVar2);
              puVar11[iVar3] = uVar4;
              puVar11 = Imf_3_4::Array2D<unsigned_int>::operator[](pAVar15,(long)iVar2);
              uVar4 = puVar11[iVar3];
              pAVar15 = Imf_3_4::Array2D<Imf_3_4::Array2D<unsigned_int>_>::operator[]
                                  ((Array2D<Imf_3_4::Array2D<unsigned_int>_> *)
                                   (anonymous_namespace)::sampleCountTiles,(long)local_544);
              puVar11 = Imf_3_4::Array2D<unsigned_int>::operator[](pAVar15 + local_548,(long)iVar2);
              puVar11[iVar3] = uVar4;
              for (local_584 = 0; local_584 < local_c; local_584 = local_584 + 1) {
                pvVar12 = std::vector<int,_std::allocator<int>_>::operator[]
                                    ((vector<int,_std::allocator<int>_> *)
                                     (anonymous_namespace)::channelTypes,(long)local_584);
                if (*pvVar12 == 0) {
                  puVar11 = Imf_3_4::Array2D<unsigned_int>::operator[](&local_308,(long)iVar2);
                  pvVar16 = operator_new__((ulong)puVar11[iVar3] << 2);
                  pAVar13 = Imf_3_4::Array::operator_cast_to_Array2D_(local_2e8);
                  ppvVar14 = Imf_3_4::Array2D<void_*>::operator[](pAVar13 + local_584,(long)iVar2);
                  ppvVar14[iVar3] = pvVar16;
                }
                pvVar12 = std::vector<int,_std::allocator<int>_>::operator[]
                                    ((vector<int,_std::allocator<int>_> *)
                                     (anonymous_namespace)::channelTypes,(long)local_584);
                if (*pvVar12 == 1) {
                  puVar11 = Imf_3_4::Array2D<unsigned_int>::operator[](&local_308,(long)iVar2);
                  pvVar16 = operator_new__((ulong)puVar11[iVar3] * 2);
                  pAVar13 = Imf_3_4::Array::operator_cast_to_Array2D_(local_2e8);
                  ppvVar14 = Imf_3_4::Array2D<void_*>::operator[](pAVar13 + local_584,(long)iVar2);
                  ppvVar14[iVar3] = pvVar16;
                }
                pvVar12 = std::vector<int,_std::allocator<int>_>::operator[]
                                    ((vector<int,_std::allocator<int>_> *)
                                     (anonymous_namespace)::channelTypes,(long)local_584);
                if (*pvVar12 == 2) {
                  puVar11 = Imf_3_4::Array2D<unsigned_int>::operator[](&local_308,(long)iVar2);
                  pvVar16 = operator_new__((ulong)puVar11[iVar3] << 2);
                  pAVar13 = Imf_3_4::Array::operator_cast_to_Array2D_(local_2e8);
                  ppvVar14 = Imf_3_4::Array2D<void_*>::operator[](pAVar13 + local_584,(long)iVar2);
                  ppvVar14[iVar3] = pvVar16;
                }
                for (local_588 = 0;
                    puVar11 = Imf_3_4::Array2D<unsigned_int>::operator[](&local_308,(long)iVar2),
                    local_588 < puVar11[iVar3]; local_588 = local_588 + 1) {
                  pvVar12 = std::vector<int,_std::allocator<int>_>::operator[]
                                      ((vector<int,_std::allocator<int>_> *)
                                       (anonymous_namespace)::channelTypes,(long)local_584);
                  if (*pvVar12 == 0) {
                    pAVar13 = Imf_3_4::Array::operator_cast_to_Array2D_(local_2e8);
                    ppvVar14 = Imf_3_4::Array2D<void_*>::operator[](pAVar13 + local_584,(long)iVar2)
                    ;
                    *(int *)((long)ppvVar14[iVar3] + (ulong)local_588 * 4) =
                         (iVar2 * 0x111 + iVar3) % 0x801;
                  }
                  pvVar12 = std::vector<int,_std::allocator<int>_>::operator[]
                                      ((vector<int,_std::allocator<int>_> *)
                                       (anonymous_namespace)::channelTypes,(long)local_584);
                  if (*pvVar12 == 1) {
                    pAVar13 = Imf_3_4::Array::operator_cast_to_Array2D_(local_2e8);
                    Imf_3_4::Array2D<void_*>::operator[](pAVar13 + local_584,(long)iVar2);
                    Imath_3_2::half::operator=
                              ((half *)CONCAT44(in_stack_fffffffffffff8e4,uVar18),
                               in_stack_fffffffffffff8dc);
                  }
                  pvVar12 = std::vector<int,_std::allocator<int>_>::operator[]
                                      ((vector<int,_std::allocator<int>_> *)
                                       (anonymous_namespace)::channelTypes,(long)local_584);
                  if (*pvVar12 == 2) {
                    fVar17 = (float)((iVar2 * 0x111 + iVar3) % 0x801);
                    pAVar13 = Imf_3_4::Array::operator_cast_to_Array2D_(local_2e8);
                    ppvVar14 = Imf_3_4::Array2D<void_*>::operator[](pAVar13 + local_584,(long)iVar2)
                    ;
                    *(float *)((long)ppvVar14[iVar3] + (ulong)local_588 * 4) = fVar17;
                  }
                }
              }
            }
          }
        }
      }
      iVar2 = Imf_3_4::DeepTiledOutputFile::numXTiles((int)local_270);
      iVar3 = Imf_3_4::DeepTiledOutputFile::numYTiles((int)local_270);
      Imf_3_4::DeepTiledOutputFile::writeTiles((int)local_270,0,iVar2 + -1,0,iVar3 + -1,local_548);
      for (local_58c = 0; iVar2 = Imf_3_4::DeepTiledOutputFile::levelHeight((int)local_270),
          local_58c < iVar2; local_58c = local_58c + 1) {
        for (local_590 = 0; iVar2 = Imf_3_4::DeepTiledOutputFile::levelWidth((int)local_270),
            local_590 < iVar2; local_590 = local_590 + 1) {
          for (local_594 = 0; local_594 < local_c; local_594 = local_594 + 1) {
            pvVar12 = std::vector<int,_std::allocator<int>_>::operator[]
                                ((vector<int,_std::allocator<int>_> *)
                                 (anonymous_namespace)::channelTypes,(long)local_594);
            if (*pvVar12 == 0) {
              pAVar13 = Imf_3_4::Array::operator_cast_to_Array2D_(local_2e8);
              ppvVar14 = Imf_3_4::Array2D<void_*>::operator[](pAVar13 + local_594,(long)local_58c);
              if (ppvVar14[local_590] != (void *)0x0) {
                operator_delete__(ppvVar14[local_590]);
              }
            }
            pvVar12 = std::vector<int,_std::allocator<int>_>::operator[]
                                ((vector<int,_std::allocator<int>_> *)
                                 (anonymous_namespace)::channelTypes,(long)local_594);
            if (*pvVar12 == 1) {
              pAVar13 = Imf_3_4::Array::operator_cast_to_Array2D_(local_2e8);
              ppvVar14 = Imf_3_4::Array2D<void_*>::operator[](pAVar13 + local_594,(long)local_58c);
              if (ppvVar14[local_590] != (void *)0x0) {
                operator_delete__(ppvVar14[local_590]);
              }
            }
            pvVar12 = std::vector<int,_std::allocator<int>_>::operator[]
                                ((vector<int,_std::allocator<int>_> *)
                                 (anonymous_namespace)::channelTypes,(long)local_594);
            if (*pvVar12 == 2) {
              pAVar13 = Imf_3_4::Array::operator_cast_to_Array2D_(local_2e8);
              ppvVar14 = Imf_3_4::Array2D<void_*>::operator[](pAVar13 + local_594,(long)local_58c);
              if (ppvVar14[local_590] != (void *)0x0) {
                operator_delete__(ppvVar14[local_590]);
              }
            }
          }
        }
      }
    }
  }
  this = (Array<Imf_3_4::Array2D<void_*>_> *)std::operator<<((ostream *)&std::cout,"   --> done");
  std::ostream::operator<<((ostream *)this,std::endl<char,std::char_traits<char>>);
  Imf_3_4::Array2D<unsigned_int>::~Array2D
            ((Array2D<unsigned_int> *)CONCAT44(in_stack_fffffffffffff8e4,uVar18));
  Imf_3_4::Array<Imf_3_4::Array2D<void_*>_>::~Array(this);
  Imf_3_4::DeepFrameBuffer::~DeepFrameBuffer((DeepFrameBuffer *)0x12d16f);
  Imf_3_4::DeepTiledOutputFile::~DeepTiledOutputFile((DeepTiledOutputFile *)local_270);
  return;
}

Assistant:

void
generateRandomTileFile (
    const std::string& filename, int channelCount, Compression compression)
{
    std::cout << "  generating deep tiled file '" << filename
              << "' compression " << compression << std::endl;
    header = Header (
        displayWindow,
        dataWindow,
        1,
        IMATH_NAMESPACE::V2f (0, 0),
        1,
        INCREASING_Y,
        compression);

    constexpr bool             relativeCoords = false;
    std::default_random_engine generator;
    auto                       generate_random_int = [&] (int range) -> int {
        std::uniform_int_distribution<int> distribution (0, range - 1);
        return distribution (generator);
    };
    //
    // Add channels.
    //

    channelTypes.clear ();

    for (int i = 0; i < channelCount; i++)
    {
        int               type = generate_random_int (3);
        std::stringstream ss;
        ss << i;
        std::string str = ss.str ();
        if (type == 0) header.channels ().insert (str, Channel (IMF::UINT));
        if (type == 1) header.channels ().insert (str, Channel (IMF::HALF));
        if (type == 2) header.channels ().insert (str, Channel (IMF::FLOAT));
        channelTypes.push_back (type);
    }

    header.setType (DEEPTILE);
    header.setTileDescription (TileDescription (
        generate_random_int (width) + 1,
        generate_random_int (height) + 1,
        RIPMAP_LEVELS));

    //
    // Set up the output file
    //
    remove (filename.c_str ());
    DeepTiledOutputFile file (filename.c_str (), header, 8);

    DeepFrameBuffer frameBuffer;

    Array<Array2D<void*>> data (channelCount);
    for (int i = 0; i < channelCount; i++)
        data[i].resizeErase (height, width);

    Array2D<unsigned int> sampleCount;
    sampleCount.resizeErase (height, width);

    std::cout << "   tileSizeX " << file.tileXSize () << "   tileSizeY "
              << file.tileYSize () << std::endl;

    sampleCountTiles.resizeErase (file.numYLevels (), file.numXLevels ());
    for (int i = 0; i < sampleCountTiles.height (); i++)
        for (int j = 0; j < sampleCountTiles.width (); j++)
            sampleCountTiles[i][j].resizeErase (height, width);

    int memOffset;
    if (relativeCoords)
        memOffset = 0;
    else
        memOffset = dataWindow.min.x + dataWindow.min.y * width;

    frameBuffer.insertSampleCountSlice (Slice (
        IMF::UINT,
        (char*) (&sampleCount[0][0] - memOffset),
        sizeof (unsigned int) * 1,
        sizeof (unsigned int) * width,
        1,
        1,
        0,
        relativeCoords,
        relativeCoords));

    for (int i = 0; i < channelCount; i++)
    {
        PixelType type = NUM_PIXELTYPES;
        if (channelTypes[i] == 0) type = IMF::UINT;
        if (channelTypes[i] == 1) type = IMF::HALF;
        if (channelTypes[i] == 2) type = IMF::FLOAT;

        std::stringstream ss;
        ss << i;
        std::string str = ss.str ();

        int sampleSize = 0;
        if (channelTypes[i] == 0) sampleSize = sizeof (unsigned int);
        if (channelTypes[i] == 1) sampleSize = sizeof (half);
        if (channelTypes[i] == 2) sampleSize = sizeof (float);

        int pointerSize = sizeof (char*);

        frameBuffer.insert (
            str,
            DeepSlice (
                type,
                (char*) (&data[i][0][0] - memOffset),
                pointerSize * 1,
                pointerSize * width,
                sampleSize,
                1,
                1,
                0,
                relativeCoords,
                relativeCoords));
    }

    file.setFrameBuffer (frameBuffer);

    for (int ly = 0; ly < file.numYLevels (); ly++)
        for (int lx = 0; lx < file.numXLevels (); lx++)
        {
            Box2i dataWindowL = file.dataWindowForLevel (lx, ly);

            for (int j = 0; j < file.numYTiles (ly); j++)
            {
                for (int i = 0; i < file.numXTiles (lx); i++)
                {
                    Box2i box = file.dataWindowForTile (i, j, lx, ly);
                    for (int y = box.min.y; y <= box.max.y; y++)
                        for (int x = box.min.x; x <= box.max.x; x++)
                        {
                            int dwy = y - dataWindowL.min.y;
                            int dwx = x - dataWindowL.min.x;
                            sampleCount[dwy][dwx] =
                                generate_random_int (10) + 1;
                            sampleCountTiles[ly][lx][dwy][dwx] =
                                sampleCount[dwy][dwx];
                            for (int k = 0; k < channelCount; k++)
                            {
                                if (channelTypes[k] == 0)
                                    data[k][dwy][dwx] =
                                        new unsigned int[sampleCount[dwy][dwx]];
                                if (channelTypes[k] == 1)
                                    data[k][dwy][dwx] =
                                        new half[sampleCount[dwy][dwx]];
                                if (channelTypes[k] == 2)
                                    data[k][dwy][dwx] =
                                        new float[sampleCount[dwy][dwx]];
                                for (unsigned int l = 0;
                                     l < sampleCount[dwy][dwx];
                                     l++)
                                {
                                    if (channelTypes[k] == 0)
                                        ((unsigned int*) data[k][dwy][dwx])[l] =
                                            (dwy * width + dwx) % 2049;
                                    if (channelTypes[k] == 1)
                                        ((half*) data[k][dwy][dwx])[l] =
                                            (dwy * width + dwx) % 2049;
                                    if (channelTypes[k] == 2)
                                        ((float*) data[k][dwy][dwx])[l] =
                                            (dwy * width + dwx) % 2049;
                                }
                            }
                        }
                }
            }

            file.writeTiles (
                0, file.numXTiles (lx) - 1, 0, file.numYTiles (ly) - 1, lx, ly);

            for (int i = 0; i < file.levelHeight (ly); i++)
                for (int j = 0; j < file.levelWidth (lx); j++)
                    for (int k = 0; k < channelCount; k++)
                    {
                        if (channelTypes[k] == 0)
                            delete[] (unsigned int*) data[k][i][j];
                        if (channelTypes[k] == 1)
                            delete[] (half*) data[k][i][j];
                        if (channelTypes[k] == 2)
                            delete[] (float*) data[k][i][j];
                    }
        }
    std::cout << "   --> done" << std::endl;
}